

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,DotExpression *expression)

{
  Expression *pEVar1;
  SymbolTable *s_00;
  Type *type;
  SymbolTable *s;
  NamedType *t;
  DotExpression *expression_local;
  SymbolTableBuilderVisitor *this_local;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  s_00 = NamedType::getSymbolTable((NamedType *)this->lastType);
  pushSymbolTable(this,s_00);
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  type = Expression::getType(pEVar1);
  setLastType(this,type);
  popSymbolTable(this);
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(DotExpression* expression) {
    NamedType* t = nullptr;
    SymbolTable* s = nullptr;

    expression->getLeft()->accept(this);
    t = (NamedType*) lastType;
    s = t->getSymbolTable();

    pushSymbolTable(s);
    expression->getRight()->accept(this);
    setLastType(expression->getRight()->getType());
    popSymbolTable();
}